

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void Cmd_openmenu(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *text;
  FName local_14;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: openmenu \"menu_name\"");
    return;
  }
  M_StartControlPanel(true);
  text = FCommandLine::operator[](argv,1);
  FName::FName(&local_14,text);
  M_SetMenu(&local_14,-1);
  return;
}

Assistant:

CCMD (openmenu)
{
	if (argv.argc() < 2)
	{
		Printf("Usage: openmenu \"menu_name\"");
		return;
	}
	M_StartControlPanel (true);
	M_SetMenu(argv[1], -1);
}